

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outputtype.cpp
# Opt level: O3

CTxDestination *
AddAndGetDestinationForScript
          (CTxDestination *__return_storage_ptr__,FlatSigningProvider *keystore,CScript *script,
          OutputType type)

{
  long in_FS_OFFSET;
  CScriptID local_b4;
  direct_or_indirect local_a0;
  uint local_84;
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_80;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CScriptID::CScriptID((CScriptID *)&local_80,script);
  std::
  _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
  ::_M_emplace_unique<CScriptID,CScript_const&>
            ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
              *)&keystore->scripts,(CScriptID *)&local_80,script);
  if (type - P2SH_SEGWIT < 2) {
    WitnessV0ScriptHash::WitnessV0ScriptHash((WitnessV0ScriptHash *)&local_80,script);
    local_80._M_index = '\x04';
    GetScriptForDestination((CScript *)&local_a0.indirect_contents,(CTxDestination *)&local_80);
    CScriptID::CScriptID(&local_b4,(CScript *)&local_a0.indirect_contents);
    std::
    _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
    ::_M_emplace_unique<CScriptID,CScript&>
              ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                *)&keystore->scripts,&local_b4,(CScript *)&local_a0.indirect_contents);
    if (type == BECH32) {
      std::__detail::__variant::
      _Move_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::_Move_ctor_base((_Move_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)__return_storage_ptr__,
                        (_Move_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_80);
    }
    else {
      ScriptHash::ScriptHash((ScriptHash *)&local_b4,(CScript *)&local_a0.indirect_contents);
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               ).
               super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               ._M_u + 0x10) =
           local_b4.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems._16_4_;
      *(undefined8 *)
       &(__return_storage_ptr__->
        super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ).
        super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ._M_u = local_b4.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               ).
               super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               ._M_u + 8) =
           local_b4.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems._8_8_;
      (__return_storage_ptr__->
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ).
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_index = '\x03';
    }
    if (0x1c < local_84) {
      free(local_a0.indirect_contents.indirect);
    }
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage(&local_80);
  }
  else {
    if (type != LEGACY) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/outputtype.cpp"
                    ,0x6b,
                    "CTxDestination AddAndGetDestinationForScript(FlatSigningProvider &, const CScript &, OutputType)"
                   );
    }
    ScriptHash::ScriptHash((ScriptHash *)__return_storage_ptr__,script);
    (__return_storage_ptr__->
    super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ).
    super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ._M_index = '\x03';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CTxDestination AddAndGetDestinationForScript(FlatSigningProvider& keystore, const CScript& script, OutputType type)
{
    // Add script to keystore
    keystore.scripts.emplace(CScriptID(script), script);

    switch (type) {
    case OutputType::LEGACY:
        return ScriptHash(script);
    case OutputType::P2SH_SEGWIT:
    case OutputType::BECH32: {
        CTxDestination witdest = WitnessV0ScriptHash(script);
        CScript witprog = GetScriptForDestination(witdest);
        // Add the redeemscript, so that P2WSH and P2SH-P2WSH outputs are recognized as ours.
        keystore.scripts.emplace(CScriptID(witprog), witprog);
        if (type == OutputType::BECH32) {
            return witdest;
        } else {
            return ScriptHash(witprog);
        }
    }
    case OutputType::BECH32M:
    case OutputType::UNKNOWN: {} // This function should not be used for BECH32M or UNKNOWN, so let it assert
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}